

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> * __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::operator=
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *other)

{
  size_t sVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar2 = other->numActive;
  if (this->numActive < uVar2) {
    reserve(this,uVar2);
    uVar2 = this->numActive;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        this->items[uVar3].object = other->items[uVar3].object;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    uVar3 = other->numActive;
    if (uVar2 < uVar3) {
      do {
        this->items[uVar2].object = other->items[uVar2].object;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    this->numActive = uVar3;
  }
  else {
    shrink(this,uVar2);
    sVar1 = this->numActive;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        this->items[sVar4].object = other->items[sVar4].object;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }